

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

void Eigen::internal::order_children<int>(int n_col,colamd_col<int> *Col,int *p)

{
  int iVar1;
  int local_30;
  int local_2c;
  int order;
  int parent;
  int c;
  int i;
  int *p_local;
  colamd_col<int> *Col_local;
  int n_col_local;
  
  for (parent = 0; parent < n_col; parent = parent + 1) {
    if ((Col[parent].start != -1) && (Col[parent].shared2.score == -1)) {
      local_2c = parent;
      do {
        local_2c = Col[local_2c].shared1.thickness;
      } while (Col[local_2c].start != -1);
      order = parent;
      local_30 = Col[local_2c].shared2.score;
      do {
        iVar1 = local_30 + 1;
        Col[order].shared2.score = local_30;
        Col[order].shared1.thickness = local_2c;
        order = Col[order].shared1.thickness;
        local_30 = iVar1;
      } while (Col[order].shared2.score == -1);
      Col[local_2c].shared2.score = iVar1;
    }
  }
  for (order = 0; order < n_col; order = order + 1) {
    p[Col[order].shared2.score] = order;
  }
  return;
}

Assistant:

static inline  void order_children
(
  /* === Parameters ======================================================= */

  Index n_col,      /* number of columns of A */
  colamd_col<Index> Col [],    /* of size n_col+1 */
  Index p []      /* p [0 ... n_col-1] is the column permutation*/
  )
{
  /* === Local variables ================================================== */

  Index i ;     /* loop counter for all columns */
  Index c ;     /* column index */
  Index parent ;    /* index of column's parent */
  Index order ;     /* column's order */

  /* === Order each non-principal column ================================== */

  for (i = 0 ; i < n_col ; i++)
  {
    /* find an un-ordered non-principal column */
    COLAMD_ASSERT (COL_IS_DEAD (i)) ;
    if (!COL_IS_DEAD_PRINCIPAL (i) && Col [i].shared2.order == COLAMD_EMPTY)
    {
      parent = i ;
      /* once found, find its principal parent */
      do
      {
	parent = Col [parent].shared1.parent ;
      } while (!COL_IS_DEAD_PRINCIPAL (parent)) ;

      /* now, order all un-ordered non-principal columns along path */
      /* to this parent.  collapse tree at the same time */
      c = i ;
      /* get order of parent */
      order = Col [parent].shared2.order ;

      do
      {
	COLAMD_ASSERT (Col [c].shared2.order == COLAMD_EMPTY) ;

	/* order this column */
	Col [c].shared2.order = order++ ;
	/* collaps tree */
	Col [c].shared1.parent = parent ;

	/* get immediate parent of this column */
	c = Col [c].shared1.parent ;

	/* continue until we hit an ordered column.  There are */
	/* guarranteed not to be anymore unordered columns */
	/* above an ordered column */
      } while (Col [c].shared2.order == COLAMD_EMPTY) ;

      /* re-order the super_col parent to largest order for this group */
      Col [parent].shared2.order = order ;
    }
  }

  /* === Generate the permutation ========================================= */

  for (c = 0 ; c < n_col ; c++)
  {
    p [Col [c].shared2.order] = c ;
  }
}